

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageOptions_SingleOptionSerializationAndDeserialization_Test
::TestBody(CoapTest_CoapMessageOptions_SingleOptionSerializationAndDeserialization_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  reference pvVar4;
  AssertHelper local_2a8;
  Message local_2a0;
  ContentFormat local_294;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_9;
  Message local_278;
  ErrorCode local_26c;
  Error local_268;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_8;
  ContentFormat contentFormat;
  Message local_220;
  int local_214;
  size_t local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_7;
  Message local_1f0;
  ErrorCode local_1e4;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_6;
  Message local_1c8;
  void *local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_198;
  Message local_190;
  type local_184;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_4;
  Message local_168;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_3;
  Message local_140;
  int local_134;
  size_type local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_2;
  Message local_110;
  ErrorCode local_104;
  Error local_100;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  Message local_c0;
  ErrorCode local_b4;
  Error local_b0;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  undefined1 local_68 [8];
  Error error;
  ByteArray buffer;
  undefined1 local_20 [8];
  shared_ptr<ot::commissioner::coap::Message> message;
  CoapTest_CoapMessageOptions_SingleOptionSerializationAndDeserialization_Test *this_local;
  
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  message.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::
  make_shared<ot::commissioner::coap::Message,ot::commissioner::coap::Type,ot::commissioner::coap::Code>
            (local_20,(Code *)((long)&buffer.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&error.mMessage.field_2 + 8));
  Error::Error((Error *)local_68);
  peVar2 = std::
           __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  Message::SetContentFormat(&local_b0,peVar2,kCBOR);
  local_b4 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_88,"message->SetContentFormat(ContentFormat::kCBOR)",
             "ErrorCode::kNone",&local_b0,&local_b4);
  Error::~Error(&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xc4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  peVar2 = std::
           __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  Message::Serialize(&local_100,peVar2,(ByteArray *)((long)&error.mMessage.field_2 + 8));
  local_104 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_d8,"message->Serialize(buffer)","ErrorCode::kNone",&local_100,
             &local_104);
  Error::~Error(&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xc5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_130 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         ((long)&error.mMessage.field_2 + 8));
  local_134 = 6;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_128,"buffer.size()","4 + 2",&local_130,&local_134);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,199,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      ((long)&error.mMessage.field_2 + 8),4);
  local_15c = 0xc1;
  testing::internal::EqHelper::Compare<unsigned_char,_int,_nullptr>
            ((EqHelper *)local_158,"buffer[4]","0xc1",pvVar4,&local_15c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,200,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      ((long)&error.mMessage.field_2 + 8),5);
  local_184 = utils::to_underlying<ot::commissioner::coap::ContentFormat>(kCBOR);
  testing::internal::EqHelper::Compare<unsigned_char,_unsigned_int,_nullptr>
            ((EqHelper *)local_180,"buffer[5]","utils::to_underlying(ContentFormat::kCBOR)",pvVar4,
             &local_184);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xc9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  Message::Deserialize
            ((Message *)&gtest_ar_5.message_,(Error *)local_68,
             (ByteArray *)((long)&error.mMessage.field_2 + 8));
  std::shared_ptr<ot::commissioner::coap::Message>::operator=
            ((shared_ptr<ot::commissioner::coap::Message> *)local_20,
             (shared_ptr<ot::commissioner::coap::Message> *)&gtest_ar_5.message_);
  std::shared_ptr<ot::commissioner::coap::Message>::~shared_ptr
            ((shared_ptr<ot::commissioner::coap::Message> *)&gtest_ar_5.message_);
  local_1c0 = (void *)0x0;
  testing::internal::CmpHelperNE<std::shared_ptr<ot::commissioner::coap::Message>,decltype(nullptr)>
            ((internal *)local_1b8,"message","nullptr",
             (shared_ptr<ot::commissioner::coap::Message> *)local_20,&local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xcc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  local_1e4 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_1e0,"error","ErrorCode::kNone",(Error *)local_68,&local_1e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xcd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  peVar2 = std::
           __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  local_210 = Message::GetOptionNum(peVar2);
  local_214 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_208,"message->GetOptionNum()","1",&local_210,&local_214);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffdd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xcf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffdd8,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffdd8);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  peVar2 = std::
           __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  Message::GetContentFormat
            (&local_268,peVar2,
             (ContentFormat *)
             ((long)&gtest_ar_8.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4));
  local_26c = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_240,"message->GetContentFormat(contentFormat)","ErrorCode::kNone",
             &local_268,&local_26c);
  Error::~Error(&local_268);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xd2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  local_294 = kCBOR;
  testing::internal::EqHelper::
  Compare<ot::commissioner::coap::ContentFormat,_ot::commissioner::coap::ContentFormat,_nullptr>
            ((EqHelper *)local_290,"contentFormat","ContentFormat::kCBOR",
             (ContentFormat *)
             ((long)&gtest_ar_8.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4),&local_294);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0xd3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  Error::~Error((Error *)local_68);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&error.mMessage.field_2 + 8));
  std::shared_ptr<ot::commissioner::coap::Message>::~shared_ptr
            ((shared_ptr<ot::commissioner::coap::Message> *)local_20);
  return;
}

Assistant:

TEST(CoapTest, CoapMessageOptions_SingleOptionSerializationAndDeserialization)
{
    auto      message = std::make_shared<Message>(Type::kConfirmable, Code::kGet);
    ByteArray buffer;
    Error     error;

    EXPECT_EQ(message->SetContentFormat(ContentFormat::kCBOR), ErrorCode::kNone);
    EXPECT_EQ(message->Serialize(buffer), ErrorCode::kNone);

    EXPECT_EQ(buffer.size(), 4 + 2);
    EXPECT_EQ(buffer[4], 0xc1);
    EXPECT_EQ(buffer[5], utils::to_underlying(ContentFormat::kCBOR));

    message = Message::Deserialize(error, buffer);
    EXPECT_NE(message, nullptr);
    EXPECT_EQ(error, ErrorCode::kNone);

    EXPECT_EQ(message->GetOptionNum(), 1);

    ContentFormat contentFormat;
    EXPECT_EQ(message->GetContentFormat(contentFormat), ErrorCode::kNone);
    EXPECT_EQ(contentFormat, ContentFormat::kCBOR);
}